

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O0

void * rw::d3d::createIndexBuffer(uint32 length,bool dynamic)

{
  void *pvVar1;
  bool dynamic_local;
  uint32 length_local;
  
  pvVar1 = mustmalloc_LOC((ulong)length,0x30b00,
                          "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d.cpp line: 101"
                         );
  return pvVar1;
}

Assistant:

void*
createIndexBuffer(uint32 length, bool dynamic)
{
#ifdef RW_D3D9
	IDirect3DIndexBuffer9 *ibuf;
	if(dynamic)
		d3ddevice->CreateIndexBuffer(length, D3DUSAGE_WRITEONLY|D3DUSAGE_DYNAMIC, D3DFMT_INDEX16, D3DPOOL_DEFAULT, &ibuf, 0);
	else
		d3ddevice->CreateIndexBuffer(length, D3DUSAGE_WRITEONLY, D3DFMT_INDEX16, D3DPOOL_MANAGED, &ibuf, 0);
	if(ibuf)
		d3d9Globals.numIndexBuffers++;
	return ibuf;
#else
	return rwNewT(uint8, length, MEMDUR_EVENT | ID_DRIVER);
#endif
}